

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O0

Type __thiscall wasm::DataFlow::Node::getWasmType(Node *this)

{
  Node *pNVar1;
  Node *this_local;
  
  switch(this->type) {
  case Var:
    this_local = (Node *)(this->field_1).expr;
    break;
  case Expr:
    this_local = (Node *)(((this->field_1).expr)->type).id;
    break;
  case Phi:
    pNVar1 = getValue(this,1);
    this_local = (Node *)getWasmType(pNVar1);
    break;
  default:
    handle_unreachable("invalid node type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/dataflow/node.h"
                       ,0xa6);
  case Zext:
    pNVar1 = getValue(this,0);
    this_local = (Node *)getWasmType(pNVar1);
    break;
  case Bad:
    wasm::Type::Type((Type *)&this_local,unreachable);
  }
  return (Type)(uintptr_t)this_local;
}

Assistant:

wasm::Type getWasmType() {
    switch (type) {
      case Var:
        return wasmType;
      case Expr:
        return expr->type;
      case Phi:
        return getValue(1)->getWasmType();
      case Zext:
        return getValue(0)->getWasmType();
      case Bad:
        return wasm::Type::unreachable;
      default:
        WASM_UNREACHABLE("invalid node type");
    }
  }